

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O2

bool isRemainingAllZero(Block *block,uint startIndex)

{
  ulong uVar1;
  ulong uVar2;
  uint j;
  
  uVar1 = (ulong)startIndex;
  do {
    uVar2 = uVar1;
    if (0x3f < uVar2) break;
    uVar1 = uVar2 + 1;
  } while ((*block)[""[uVar2]] == 0);
  return 0x3f < uVar2;
}

Assistant:

bool isRemainingAllZero(const Block& block, uint startIndex) {
    bool isAllZero = true; //judge if all other pixels that follow are zero
    for(uint j = startIndex; j < 64; j++) {
        if(block[ZIG_ZAG[j]] != 0) {
            isAllZero = false;
            break;
        }
    }
    return isAllZero;
}